

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_settings.cpp
# Opt level: O2

void __thiscall ON_3dmViewPosition::Default(ON_3dmViewPosition *this)

{
  *(undefined4 *)&this->m_wnd_left = 0;
  *(undefined4 *)((long)&this->m_wnd_left + 4) = 0;
  *(undefined4 *)&this->m_wnd_right = 0;
  *(undefined4 *)((long)&this->m_wnd_right + 4) = 0x3ff00000;
  *(undefined4 *)&this->m_wnd_top = 0;
  *(undefined4 *)((long)&this->m_wnd_top + 4) = 0;
  *(undefined4 *)&this->m_wnd_bottom = 0;
  *(undefined4 *)((long)&this->m_wnd_bottom + 4) = 0x3ff00000;
  this->m_bMaximized = false;
  this->m_floating_viewport = '\0';
  this->m_reserved_1 = '\0';
  this->m_reserved_2 = '\0';
  this->m_reserved_3 = '\0';
  return;
}

Assistant:

void ON_3dmViewPosition::Default()
{
  m_wnd_left   = 0.0;
  m_wnd_right  = 1.0;
  m_wnd_top    = 0.0;
  m_wnd_bottom = 1.0;
  m_bMaximized = false;

  m_floating_viewport = 0;
  m_reserved_1 = 0;
  m_reserved_2 = 0;
  m_reserved_3 = 0;
}